

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O0

double icu_63::gregorianToJD(int32_t year,int32_t month,int32_t date)

{
  UBool UVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 local_4c;
  double julianDay;
  int32_t date_local;
  int32_t month_local;
  int32_t year_local;
  
  dVar2 = uprv_floor_63((double)((year + -1) / 4));
  dVar3 = uprv_floor_63((double)((year + -1) / 100));
  dVar4 = uprv_floor_63((double)((year + -1) / 400));
  if (month < 3) {
    local_4c = 0;
  }
  else {
    UVar1 = isGregorianLeap(year);
    local_4c = -2;
    if (UVar1 != '\0') {
      local_4c = -1;
    }
  }
  dVar5 = uprv_floor_63((double)((month * 0x16f + -0x16a) / 0xc + local_4c + date));
  return (double)((year + -1) * 0x16d) + 1721424.5 + dVar2 + -dVar3 + dVar4 + dVar5;
}

Assistant:

static double gregorianToJD(int32_t year, int32_t month, int32_t date) {
   double julianDay = (JULIAN_EPOCH - 1) +
      (365 * (year - 1)) +
      uprv_floor((year - 1) / 4) +
      (-uprv_floor((year - 1) / 100)) +
      uprv_floor((year - 1) / 400) +
      uprv_floor((((367 * month) - 362) / 12) +
            ((month <= 2) ? 0 :
             (isGregorianLeap(year) ? -1 : -2)
            ) +
            date);

   return julianDay;
}